

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O3

void project_monster_handler_CHAOS(project_monster_handler_context_t *context)

{
  _Bool _Var1;
  uint32_t uVar2;
  
  _Var1 = flag_has_dbg(context->mon->race->spell_flags,0xd,0x10,"context->mon->race->spell_flags",
                       "RSF_BR_CHAO");
  context->do_poly = (uint)!_Var1;
  uVar2 = Rand_div(10);
  context->mon_timed[2] = (uVar2 + context->r + 0xb) / (context->r + L'\x01');
  project_monster_breath(context,L'\x10',L'\x03');
  context->hurt_msg = MON_MSG_NONE;
  return;
}

Assistant:

static void project_monster_handler_CHAOS(project_monster_handler_context_t *context)
{
	/* Prevent polymorph on chaos breathers. */
	if (rsf_has(context->mon->race->spell_flags, RSF_BR_CHAO))
		context->do_poly = 0;
	else
		context->do_poly = 1;

	/* Hide resistance message (as assigned in project_monster_breath()). */
	context->mon_timed[MON_TMD_CONF] = adjust_radius(context, 10 + randint1(10));
	project_monster_breath(context, RSF_BR_CHAO, 3);
	context->hurt_msg = MON_MSG_NONE;
}